

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

bool __thiscall cmComputeTargetDepends::Compute(cmComputeTargetDepends *this)

{
  bool bVar1;
  cmComputeComponentGraph ccg;
  allocator local_111;
  string local_110;
  cmComputeComponentGraph local_f0;
  
  CollectTargets(this);
  CollectDepends(this);
  if (this->DebugMode == true) {
    std::__cxx11::string::string((string *)&local_f0,"initial",(allocator *)&local_110);
    DisplayGraph(this,&this->InitialGraph,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  cmComputeComponentGraph::cmComputeComponentGraph(&local_f0,&this->InitialGraph);
  if (this->DebugMode == true) {
    DisplayComponents(this,&local_f0);
  }
  bVar1 = CheckComponents(this,&local_f0);
  if (bVar1) {
    bVar1 = ComputeFinalDepends(this,&local_f0);
    if (bVar1) {
      bVar1 = true;
      if (this->DebugMode == true) {
        std::__cxx11::string::string((string *)&local_110,"final",&local_111);
        DisplayGraph(this,&this->FinalGraph,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
      }
      goto LAB_003f00cf;
    }
  }
  bVar1 = false;
LAB_003f00cf:
  cmComputeComponentGraph::~cmComputeComponentGraph(&local_f0);
  return bVar1;
}

Assistant:

bool cmComputeTargetDepends::Compute()
{
  // Build the original graph.
  this->CollectTargets();
  this->CollectDepends();
  if(this->DebugMode)
    {
    this->DisplayGraph(this->InitialGraph, "initial");
    }

  // Identify components.
  cmComputeComponentGraph ccg(this->InitialGraph);
  if(this->DebugMode)
    {
    this->DisplayComponents(ccg);
    }
  if(!this->CheckComponents(ccg))
    {
    return false;
    }

  // Compute the final dependency graph.
  if(!this->ComputeFinalDepends(ccg))
    {
    return false;
    }
  if(this->DebugMode)
    {
    this->DisplayGraph(this->FinalGraph, "final");
    }

  return true;
}